

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention_x86_avx::create_pipeline(MultiHeadAttention_x86_avx *this,Option *_opt)

{
  Mat *pMVar1;
  Mat *pMVar2;
  int *piVar3;
  void *pvVar4;
  Allocator *pAVar5;
  long *plVar6;
  Layer *pLVar7;
  long lVar8;
  int iVar9;
  ParamDict pd_4;
  ParamDict pd_1;
  ParamDict pd;
  Option opt;
  ParamDict PStack_1c8;
  undefined1 local_1b8 [80];
  Mat local_168;
  void *local_120;
  int *piStack_118;
  size_t local_110;
  int local_108;
  Allocator *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8;
  size_t local_e0;
  _func_int **local_d8;
  int *piStack_d0;
  size_t local_c8;
  int local_c0;
  Allocator *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  int local_a0;
  size_t local_98;
  int local_8c;
  undefined8 local_88;
  Allocator *pAStack_80;
  Allocator *pAStack_78;
  undefined8 uStack_70;
  Allocator *local_68;
  int iStack_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  ModelBinFromMatArray local_40;
  
  local_88._0_1_ = _opt->lightmode;
  local_88._1_1_ = _opt->use_shader_pack8;
  local_88._2_1_ = _opt->use_subgroup_ops;
  local_88._3_1_ = _opt->use_reserved_0;
  local_88._4_4_ = _opt->num_threads;
  pAStack_80 = _opt->blob_allocator;
  pAStack_78 = _opt->workspace_allocator;
  uStack_70._0_4_ = _opt->openmp_blocktime;
  uStack_70._4_1_ = _opt->use_winograd_convolution;
  uStack_70._5_1_ = _opt->use_sgemm_convolution;
  uStack_70._6_1_ = _opt->use_int8_inference;
  uStack_70._7_1_ = _opt->use_vulkan_compute;
  local_68 = *(Allocator **)&_opt->use_bf16_storage;
  _iStack_60 = *(undefined8 *)&_opt->vulkan_device_index;
  _iStack_58 = *(undefined8 *)&_opt->flush_denormals;
  _iStack_50 = *(undefined8 *)&_opt->use_winograd43_convolution;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    (this->super_MultiHeadAttention).super_Layer.support_packing = false;
    local_68 = (Allocator *)((ulong)local_68 & 0xffffffffffffff);
  }
  pLVar7 = create_layer_cpu(0x20);
  this->qk_softmax = pLVar7;
  ParamDict::ParamDict((ParamDict *)&local_168);
  ParamDict::set((ParamDict *)&local_168,0,-1);
  ParamDict::set((ParamDict *)&local_168,1,1);
  (*this->qk_softmax->_vptr_Layer[2])();
  pLVar7 = this->qk_softmax;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)local_1b8,(Mat *)0x0);
  (*pLVar7->_vptr_Layer[3])(pLVar7,local_1b8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)local_1b8);
  (*this->qk_softmax->_vptr_Layer[4])();
  ParamDict::~ParamDict((ParamDict *)&local_168);
  iVar9 = (this->super_MultiHeadAttention).weight_data_size /
          (this->super_MultiHeadAttention).embed_dim;
  pLVar7 = create_layer_cpu(0x4a);
  this->q_gemm = pLVar7;
  ParamDict::ParamDict((ParamDict *)local_1b8);
  ParamDict::set((ParamDict *)local_1b8,0,(this->super_MultiHeadAttention).scale);
  ParamDict::set((ParamDict *)local_1b8,1,1.0);
  ParamDict::set((ParamDict *)local_1b8,2,0);
  ParamDict::set((ParamDict *)local_1b8,3,1);
  ParamDict::set((ParamDict *)local_1b8,4,1);
  ParamDict::set((ParamDict *)local_1b8,5,0);
  ParamDict::set((ParamDict *)local_1b8,6,1);
  ParamDict::set((ParamDict *)local_1b8,7,(this->super_MultiHeadAttention).embed_dim);
  ParamDict::set((ParamDict *)local_1b8,8,0);
  ParamDict::set((ParamDict *)local_1b8,9,iVar9);
  ParamDict::set((ParamDict *)local_1b8,10,1);
  ParamDict::set((ParamDict *)local_1b8,0xb,0);
  ParamDict::set((ParamDict *)local_1b8,0xc,1);
  ParamDict::set((ParamDict *)local_1b8,0xe,0);
  ParamDict::set((ParamDict *)local_1b8,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->q_gemm->_vptr_Layer[2])(this->q_gemm,local_1b8);
  lVar8 = 0x40;
  local_8c = iVar9;
  do {
    *(undefined8 *)((long)&local_168.data + lVar8) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x10) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x18) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x1c) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x24) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x30) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x38) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x3c) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x44) = 0;
    lVar8 = lVar8 + 0x48;
  } while (lVar8 != 0x118);
  pMVar1 = &(this->super_MultiHeadAttention).q_weight_data;
  if (&local_168 != pMVar1) {
    piVar3 = (this->super_MultiHeadAttention).q_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (local_168.refcount != (int *)0x0) {
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      if (*local_168.refcount == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_168.data = (this->super_MultiHeadAttention).q_weight_data.data;
    local_168.refcount = (this->super_MultiHeadAttention).q_weight_data.refcount;
    local_168.elemsize = (this->super_MultiHeadAttention).q_weight_data.elemsize;
    local_168.elempack = (this->super_MultiHeadAttention).q_weight_data.elempack;
    local_168.allocator = (this->super_MultiHeadAttention).q_weight_data.allocator;
    local_168.dims = (this->super_MultiHeadAttention).q_weight_data.dims;
    local_168.w = (this->super_MultiHeadAttention).q_weight_data.w;
    local_168.h = (this->super_MultiHeadAttention).q_weight_data.h;
    local_168.d = (this->super_MultiHeadAttention).q_weight_data.d;
    local_168.c = (this->super_MultiHeadAttention).q_weight_data.c;
    local_168.cstep = (this->super_MultiHeadAttention).q_weight_data.cstep;
  }
  pMVar2 = &(this->super_MultiHeadAttention).q_bias_data;
  if ((Mat *)&local_120 != pMVar2) {
    piVar3 = (this->super_MultiHeadAttention).q_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_118 != (int *)0x0) {
      LOCK();
      *piStack_118 = *piStack_118 + -1;
      UNLOCK();
      if (*piStack_118 == 0) {
        if (local_100 == (Allocator *)0x0) {
          if (local_120 != (void *)0x0) {
            free(local_120);
          }
        }
        else {
          (*local_100->_vptr_Allocator[3])();
        }
      }
    }
    local_120 = (this->super_MultiHeadAttention).q_bias_data.data;
    piStack_118 = (this->super_MultiHeadAttention).q_bias_data.refcount;
    local_110 = (this->super_MultiHeadAttention).q_bias_data.elemsize;
    local_108 = (this->super_MultiHeadAttention).q_bias_data.elempack;
    local_100 = (this->super_MultiHeadAttention).q_bias_data.allocator;
    local_f8._0_4_ = (this->super_MultiHeadAttention).q_bias_data.dims;
    local_f8._4_4_ = (this->super_MultiHeadAttention).q_bias_data.w;
    uStack_f0._0_4_ = (this->super_MultiHeadAttention).q_bias_data.h;
    uStack_f0._4_4_ = (this->super_MultiHeadAttention).q_bias_data.d;
    local_e8 = (this->super_MultiHeadAttention).q_bias_data.c;
    local_e0 = (this->super_MultiHeadAttention).q_bias_data.cstep;
  }
  if ((Mat *)&local_d8 != &(this->super_MultiHeadAttention).q_weight_data_int8_scales) {
    piVar3 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_d0 != (int *)0x0) {
      LOCK();
      *piStack_d0 = *piStack_d0 + -1;
      UNLOCK();
      if (*piStack_d0 == 0) {
        if (local_b8 == (Allocator *)0x0) {
          if (local_d8 != (_func_int **)0x0) {
            free(local_d8);
          }
        }
        else {
          (*local_b8->_vptr_Allocator[3])();
        }
      }
    }
    local_d8 = (_func_int **)(this->super_MultiHeadAttention).q_weight_data_int8_scales.data;
    piStack_d0 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.refcount;
    local_c8 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.elemsize;
    local_c0 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.elempack;
    local_b8 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.allocator;
    local_b0._0_4_ = (this->super_MultiHeadAttention).q_weight_data_int8_scales.dims;
    local_b0._4_4_ = (this->super_MultiHeadAttention).q_weight_data_int8_scales.w;
    uStack_a8._0_4_ = (this->super_MultiHeadAttention).q_weight_data_int8_scales.h;
    uStack_a8._4_4_ = (this->super_MultiHeadAttention).q_weight_data_int8_scales.d;
    local_a0 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.c;
    local_98 = (this->super_MultiHeadAttention).q_weight_data_int8_scales.cstep;
  }
  pLVar7 = this->q_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_1c8,&local_168);
  (*pLVar7->_vptr_Layer[3])(pLVar7,&PStack_1c8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_1c8);
  (*this->q_gemm->_vptr_Layer[4])(this->q_gemm,&local_88);
  if ((char)local_88 != '\0') {
    piVar3 = (this->super_MultiHeadAttention).q_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->super_MultiHeadAttention).q_weight_data.data;
        pAVar5 = (this->super_MultiHeadAttention).q_weight_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).q_weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).q_weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).q_weight_data.elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->super_MultiHeadAttention).q_weight_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).q_weight_data.dims = 0;
    (this->super_MultiHeadAttention).q_weight_data.w = 0;
    (this->super_MultiHeadAttention).q_weight_data.h = 0;
    (this->super_MultiHeadAttention).q_weight_data.d = 0;
    (this->super_MultiHeadAttention).q_weight_data.c = 0;
    piVar3 = (this->super_MultiHeadAttention).q_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->super_MultiHeadAttention).q_bias_data.data;
        pAVar5 = (this->super_MultiHeadAttention).q_bias_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).q_bias_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).q_bias_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).q_bias_data.elemsize + 4) = 0;
    pMVar2->data = (void *)0x0;
    (this->super_MultiHeadAttention).q_bias_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).q_bias_data.dims = 0;
    (this->super_MultiHeadAttention).q_bias_data.w = 0;
    (this->super_MultiHeadAttention).q_bias_data.h = 0;
    (this->super_MultiHeadAttention).q_bias_data.d = 0;
    (this->super_MultiHeadAttention).q_bias_data.c = 0;
  }
  lVar8 = 0x90;
  do {
    piVar3 = *(int **)((long)&local_168.refcount + lVar8);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = *(void **)((long)&local_168.data + lVar8);
        plVar6 = *(long **)((long)&local_168.allocator + lVar8);
        if (plVar6 == (long *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (**(code **)(*plVar6 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_168.cstep + lVar8) = 0;
    *(undefined8 *)((long)&local_168.refcount + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_168.elemsize + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_168.data + lVar8) = 0;
    *(undefined8 *)((long)&local_168.refcount + lVar8) = 0;
    *(undefined8 *)((long)&local_168.dims + lVar8) = 0;
    *(undefined8 *)((long)&local_168.h + lVar8) = 0;
    *(undefined4 *)((long)&local_168.c + lVar8) = 0;
    lVar8 = lVar8 + -0x48;
  } while (lVar8 != -0x48);
  ParamDict::~ParamDict((ParamDict *)local_1b8);
  pLVar7 = create_layer_cpu(0x4a);
  this->k_gemm = pLVar7;
  ParamDict::ParamDict((ParamDict *)local_1b8);
  ParamDict::set((ParamDict *)local_1b8,2,0);
  ParamDict::set((ParamDict *)local_1b8,3,1);
  ParamDict::set((ParamDict *)local_1b8,4,1);
  ParamDict::set((ParamDict *)local_1b8,5,0);
  ParamDict::set((ParamDict *)local_1b8,6,1);
  ParamDict::set((ParamDict *)local_1b8,7,(this->super_MultiHeadAttention).embed_dim);
  ParamDict::set((ParamDict *)local_1b8,8,0);
  ParamDict::set((ParamDict *)local_1b8,9,(this->super_MultiHeadAttention).kdim);
  ParamDict::set((ParamDict *)local_1b8,10,1);
  ParamDict::set((ParamDict *)local_1b8,0xb,0);
  ParamDict::set((ParamDict *)local_1b8,0xc,1);
  ParamDict::set((ParamDict *)local_1b8,0xe,0);
  ParamDict::set((ParamDict *)local_1b8,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->k_gemm->_vptr_Layer[2])(this->k_gemm,local_1b8);
  lVar8 = 0x40;
  do {
    *(undefined8 *)((long)&local_168.data + lVar8) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x10) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x18) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x1c) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x24) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x30) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x38) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x3c) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x44) = 0;
    lVar8 = lVar8 + 0x48;
  } while (lVar8 != 0x118);
  pMVar1 = &(this->super_MultiHeadAttention).k_weight_data;
  if (&local_168 != pMVar1) {
    piVar3 = (this->super_MultiHeadAttention).k_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (local_168.refcount != (int *)0x0) {
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      if (*local_168.refcount == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_168.data = (this->super_MultiHeadAttention).k_weight_data.data;
    local_168.refcount = (this->super_MultiHeadAttention).k_weight_data.refcount;
    local_168.elemsize = (this->super_MultiHeadAttention).k_weight_data.elemsize;
    local_168.elempack = (this->super_MultiHeadAttention).k_weight_data.elempack;
    local_168.allocator = (this->super_MultiHeadAttention).k_weight_data.allocator;
    local_168.dims = (this->super_MultiHeadAttention).k_weight_data.dims;
    local_168.w = (this->super_MultiHeadAttention).k_weight_data.w;
    local_168.h = (this->super_MultiHeadAttention).k_weight_data.h;
    local_168.d = (this->super_MultiHeadAttention).k_weight_data.d;
    local_168.c = (this->super_MultiHeadAttention).k_weight_data.c;
    local_168.cstep = (this->super_MultiHeadAttention).k_weight_data.cstep;
  }
  pMVar2 = &(this->super_MultiHeadAttention).k_bias_data;
  if ((Mat *)&local_120 != pMVar2) {
    piVar3 = (this->super_MultiHeadAttention).k_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_118 != (int *)0x0) {
      LOCK();
      *piStack_118 = *piStack_118 + -1;
      UNLOCK();
      if (*piStack_118 == 0) {
        if (local_100 == (Allocator *)0x0) {
          if (local_120 != (void *)0x0) {
            free(local_120);
          }
        }
        else {
          (*local_100->_vptr_Allocator[3])();
        }
      }
    }
    local_120 = (this->super_MultiHeadAttention).k_bias_data.data;
    piStack_118 = (this->super_MultiHeadAttention).k_bias_data.refcount;
    local_110 = (this->super_MultiHeadAttention).k_bias_data.elemsize;
    local_108 = (this->super_MultiHeadAttention).k_bias_data.elempack;
    local_100 = (this->super_MultiHeadAttention).k_bias_data.allocator;
    local_f8._0_4_ = (this->super_MultiHeadAttention).k_bias_data.dims;
    local_f8._4_4_ = (this->super_MultiHeadAttention).k_bias_data.w;
    uStack_f0._0_4_ = (this->super_MultiHeadAttention).k_bias_data.h;
    uStack_f0._4_4_ = (this->super_MultiHeadAttention).k_bias_data.d;
    local_e8 = (this->super_MultiHeadAttention).k_bias_data.c;
    local_e0 = (this->super_MultiHeadAttention).k_bias_data.cstep;
  }
  if ((Mat *)&local_d8 != &(this->super_MultiHeadAttention).k_weight_data_int8_scales) {
    piVar3 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_d0 != (int *)0x0) {
      LOCK();
      *piStack_d0 = *piStack_d0 + -1;
      UNLOCK();
      if (*piStack_d0 == 0) {
        if (local_b8 == (Allocator *)0x0) {
          if (local_d8 != (_func_int **)0x0) {
            free(local_d8);
          }
        }
        else {
          (*local_b8->_vptr_Allocator[3])();
        }
      }
    }
    local_d8 = (_func_int **)(this->super_MultiHeadAttention).k_weight_data_int8_scales.data;
    piStack_d0 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.refcount;
    local_c8 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.elemsize;
    local_c0 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.elempack;
    local_b8 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.allocator;
    local_b0._0_4_ = (this->super_MultiHeadAttention).k_weight_data_int8_scales.dims;
    local_b0._4_4_ = (this->super_MultiHeadAttention).k_weight_data_int8_scales.w;
    uStack_a8._0_4_ = (this->super_MultiHeadAttention).k_weight_data_int8_scales.h;
    uStack_a8._4_4_ = (this->super_MultiHeadAttention).k_weight_data_int8_scales.d;
    local_a0 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.c;
    local_98 = (this->super_MultiHeadAttention).k_weight_data_int8_scales.cstep;
  }
  pLVar7 = this->k_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_1c8,&local_168);
  (*pLVar7->_vptr_Layer[3])(pLVar7,&PStack_1c8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_1c8);
  (*this->k_gemm->_vptr_Layer[4])(this->k_gemm,&local_88);
  if ((char)local_88 != '\0') {
    piVar3 = (this->super_MultiHeadAttention).k_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->super_MultiHeadAttention).k_weight_data.data;
        pAVar5 = (this->super_MultiHeadAttention).k_weight_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).k_weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).k_weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).k_weight_data.elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->super_MultiHeadAttention).k_weight_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).k_weight_data.dims = 0;
    (this->super_MultiHeadAttention).k_weight_data.w = 0;
    (this->super_MultiHeadAttention).k_weight_data.h = 0;
    (this->super_MultiHeadAttention).k_weight_data.d = 0;
    (this->super_MultiHeadAttention).k_weight_data.c = 0;
    piVar3 = (this->super_MultiHeadAttention).k_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->super_MultiHeadAttention).k_bias_data.data;
        pAVar5 = (this->super_MultiHeadAttention).k_bias_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).k_bias_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).k_bias_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).k_bias_data.elemsize + 4) = 0;
    pMVar2->data = (void *)0x0;
    (this->super_MultiHeadAttention).k_bias_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).k_bias_data.dims = 0;
    (this->super_MultiHeadAttention).k_bias_data.w = 0;
    (this->super_MultiHeadAttention).k_bias_data.h = 0;
    (this->super_MultiHeadAttention).k_bias_data.d = 0;
    (this->super_MultiHeadAttention).k_bias_data.c = 0;
  }
  lVar8 = 0x90;
  do {
    piVar3 = *(int **)((long)&local_168.refcount + lVar8);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = *(void **)((long)&local_168.data + lVar8);
        plVar6 = *(long **)((long)&local_168.allocator + lVar8);
        if (plVar6 == (long *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (**(code **)(*plVar6 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_168.cstep + lVar8) = 0;
    *(undefined8 *)((long)&local_168.refcount + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_168.elemsize + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_168.data + lVar8) = 0;
    *(undefined8 *)((long)&local_168.refcount + lVar8) = 0;
    *(undefined8 *)((long)&local_168.dims + lVar8) = 0;
    *(undefined8 *)((long)&local_168.h + lVar8) = 0;
    *(undefined4 *)((long)&local_168.c + lVar8) = 0;
    lVar8 = lVar8 + -0x48;
  } while (lVar8 != -0x48);
  ParamDict::~ParamDict((ParamDict *)local_1b8);
  pLVar7 = create_layer_cpu(0x4a);
  this->v_gemm = pLVar7;
  ParamDict::ParamDict((ParamDict *)local_1b8);
  ParamDict::set((ParamDict *)local_1b8,2,0);
  ParamDict::set((ParamDict *)local_1b8,3,1);
  ParamDict::set((ParamDict *)local_1b8,4,1);
  ParamDict::set((ParamDict *)local_1b8,5,0);
  ParamDict::set((ParamDict *)local_1b8,6,1);
  ParamDict::set((ParamDict *)local_1b8,7,(this->super_MultiHeadAttention).embed_dim);
  ParamDict::set((ParamDict *)local_1b8,8,0);
  ParamDict::set((ParamDict *)local_1b8,9,(this->super_MultiHeadAttention).vdim);
  ParamDict::set((ParamDict *)local_1b8,10,1);
  ParamDict::set((ParamDict *)local_1b8,0xb,0);
  ParamDict::set((ParamDict *)local_1b8,0xc,1);
  ParamDict::set((ParamDict *)local_1b8,0xe,0);
  ParamDict::set((ParamDict *)local_1b8,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->v_gemm->_vptr_Layer[2])(this->v_gemm,local_1b8);
  lVar8 = 0x40;
  do {
    *(undefined8 *)((long)&local_168.data + lVar8) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x10) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x18) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x1c) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x24) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x30) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x38) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x3c) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x44) = 0;
    lVar8 = lVar8 + 0x48;
  } while (lVar8 != 0x118);
  pMVar1 = &(this->super_MultiHeadAttention).v_weight_data;
  if (&local_168 != pMVar1) {
    piVar3 = (this->super_MultiHeadAttention).v_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (local_168.refcount != (int *)0x0) {
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      if (*local_168.refcount == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_168.data = (this->super_MultiHeadAttention).v_weight_data.data;
    local_168.refcount = (this->super_MultiHeadAttention).v_weight_data.refcount;
    local_168.elemsize = (this->super_MultiHeadAttention).v_weight_data.elemsize;
    local_168.elempack = (this->super_MultiHeadAttention).v_weight_data.elempack;
    local_168.allocator = (this->super_MultiHeadAttention).v_weight_data.allocator;
    local_168.dims = (this->super_MultiHeadAttention).v_weight_data.dims;
    local_168.w = (this->super_MultiHeadAttention).v_weight_data.w;
    local_168.h = (this->super_MultiHeadAttention).v_weight_data.h;
    local_168.d = (this->super_MultiHeadAttention).v_weight_data.d;
    local_168.c = (this->super_MultiHeadAttention).v_weight_data.c;
    local_168.cstep = (this->super_MultiHeadAttention).v_weight_data.cstep;
  }
  pMVar2 = &(this->super_MultiHeadAttention).v_bias_data;
  if ((Mat *)&local_120 != pMVar2) {
    piVar3 = (this->super_MultiHeadAttention).v_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_118 != (int *)0x0) {
      LOCK();
      *piStack_118 = *piStack_118 + -1;
      UNLOCK();
      if (*piStack_118 == 0) {
        if (local_100 == (Allocator *)0x0) {
          if (local_120 != (void *)0x0) {
            free(local_120);
          }
        }
        else {
          (*local_100->_vptr_Allocator[3])();
        }
      }
    }
    local_120 = (this->super_MultiHeadAttention).v_bias_data.data;
    piStack_118 = (this->super_MultiHeadAttention).v_bias_data.refcount;
    local_110 = (this->super_MultiHeadAttention).v_bias_data.elemsize;
    local_108 = (this->super_MultiHeadAttention).v_bias_data.elempack;
    local_100 = (this->super_MultiHeadAttention).v_bias_data.allocator;
    local_f8._0_4_ = (this->super_MultiHeadAttention).v_bias_data.dims;
    local_f8._4_4_ = (this->super_MultiHeadAttention).v_bias_data.w;
    uStack_f0._0_4_ = (this->super_MultiHeadAttention).v_bias_data.h;
    uStack_f0._4_4_ = (this->super_MultiHeadAttention).v_bias_data.d;
    local_e8 = (this->super_MultiHeadAttention).v_bias_data.c;
    local_e0 = (this->super_MultiHeadAttention).v_bias_data.cstep;
  }
  if ((Mat *)&local_d8 != &(this->super_MultiHeadAttention).v_weight_data_int8_scales) {
    piVar3 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_d0 != (int *)0x0) {
      LOCK();
      *piStack_d0 = *piStack_d0 + -1;
      UNLOCK();
      if (*piStack_d0 == 0) {
        if (local_b8 == (Allocator *)0x0) {
          if (local_d8 != (_func_int **)0x0) {
            free(local_d8);
          }
        }
        else {
          (*local_b8->_vptr_Allocator[3])();
        }
      }
    }
    local_d8 = (_func_int **)(this->super_MultiHeadAttention).v_weight_data_int8_scales.data;
    piStack_d0 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.refcount;
    local_c8 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.elemsize;
    local_c0 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.elempack;
    local_b8 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.allocator;
    local_b0._0_4_ = (this->super_MultiHeadAttention).v_weight_data_int8_scales.dims;
    local_b0._4_4_ = (this->super_MultiHeadAttention).v_weight_data_int8_scales.w;
    uStack_a8._0_4_ = (this->super_MultiHeadAttention).v_weight_data_int8_scales.h;
    uStack_a8._4_4_ = (this->super_MultiHeadAttention).v_weight_data_int8_scales.d;
    local_a0 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.c;
    local_98 = (this->super_MultiHeadAttention).v_weight_data_int8_scales.cstep;
  }
  pLVar7 = this->v_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_1c8,&local_168);
  (*pLVar7->_vptr_Layer[3])(pLVar7,&PStack_1c8);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&PStack_1c8);
  (*this->v_gemm->_vptr_Layer[4])(this->v_gemm,&local_88);
  if ((char)local_88 != '\0') {
    piVar3 = (this->super_MultiHeadAttention).v_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->super_MultiHeadAttention).v_weight_data.data;
        pAVar5 = (this->super_MultiHeadAttention).v_weight_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).v_weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).v_weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).v_weight_data.elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->super_MultiHeadAttention).v_weight_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).v_weight_data.dims = 0;
    (this->super_MultiHeadAttention).v_weight_data.w = 0;
    (this->super_MultiHeadAttention).v_weight_data.h = 0;
    (this->super_MultiHeadAttention).v_weight_data.d = 0;
    (this->super_MultiHeadAttention).v_weight_data.c = 0;
    piVar3 = (this->super_MultiHeadAttention).v_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->super_MultiHeadAttention).v_bias_data.data;
        pAVar5 = (this->super_MultiHeadAttention).v_bias_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).v_bias_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).v_bias_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).v_bias_data.elemsize + 4) = 0;
    pMVar2->data = (void *)0x0;
    (this->super_MultiHeadAttention).v_bias_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).v_bias_data.dims = 0;
    (this->super_MultiHeadAttention).v_bias_data.w = 0;
    (this->super_MultiHeadAttention).v_bias_data.h = 0;
    (this->super_MultiHeadAttention).v_bias_data.d = 0;
    (this->super_MultiHeadAttention).v_bias_data.c = 0;
  }
  iVar9 = local_8c;
  lVar8 = 0x90;
  do {
    piVar3 = *(int **)((long)&local_168.refcount + lVar8);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = *(void **)((long)&local_168.data + lVar8);
        plVar6 = *(long **)((long)&local_168.allocator + lVar8);
        if (plVar6 == (long *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (**(code **)(*plVar6 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_168.cstep + lVar8) = 0;
    *(undefined8 *)((long)&local_168.refcount + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_168.elemsize + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_168.data + lVar8) = 0;
    *(undefined8 *)((long)&local_168.refcount + lVar8) = 0;
    *(undefined8 *)((long)&local_168.dims + lVar8) = 0;
    *(undefined8 *)((long)&local_168.h + lVar8) = 0;
    *(undefined4 *)((long)&local_168.c + lVar8) = 0;
    lVar8 = lVar8 + -0x48;
  } while (lVar8 != -0x48);
  ParamDict::~ParamDict((ParamDict *)local_1b8);
  pLVar7 = create_layer_cpu(0x4a);
  this->o_gemm = pLVar7;
  ParamDict::ParamDict(&PStack_1c8);
  ParamDict::set(&PStack_1c8,2,1);
  ParamDict::set(&PStack_1c8,3,1);
  ParamDict::set(&PStack_1c8,4,0);
  ParamDict::set(&PStack_1c8,5,1);
  ParamDict::set(&PStack_1c8,6,1);
  ParamDict::set(&PStack_1c8,7,0);
  ParamDict::set(&PStack_1c8,8,iVar9);
  ParamDict::set(&PStack_1c8,9,(this->super_MultiHeadAttention).embed_dim);
  ParamDict::set(&PStack_1c8,10,4);
  ParamDict::set(&PStack_1c8,0xb,0);
  ParamDict::set(&PStack_1c8,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->o_gemm->_vptr_Layer[2])(this->o_gemm,&PStack_1c8);
  lVar8 = 0x40;
  do {
    *(undefined8 *)((long)&local_168.data + lVar8) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x10) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x18) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x1c) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x24) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x30) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x38) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x3c) = 0;
    *(undefined8 *)(local_1b8 + lVar8 + 0x44) = 0;
    lVar8 = lVar8 + 0x48;
  } while (lVar8 != 0x118);
  pMVar1 = &(this->super_MultiHeadAttention).out_weight_data;
  if (&local_168 != pMVar1) {
    piVar3 = (this->super_MultiHeadAttention).out_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (local_168.refcount != (int *)0x0) {
      LOCK();
      *local_168.refcount = *local_168.refcount + -1;
      UNLOCK();
      if (*local_168.refcount == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          if (local_168.data != (void *)0x0) {
            free(local_168.data);
          }
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_168.data = (this->super_MultiHeadAttention).out_weight_data.data;
    local_168.refcount = (this->super_MultiHeadAttention).out_weight_data.refcount;
    local_168.elemsize = (this->super_MultiHeadAttention).out_weight_data.elemsize;
    local_168.elempack = (this->super_MultiHeadAttention).out_weight_data.elempack;
    local_168.allocator = (this->super_MultiHeadAttention).out_weight_data.allocator;
    local_168.dims = (this->super_MultiHeadAttention).out_weight_data.dims;
    local_168.w = (this->super_MultiHeadAttention).out_weight_data.w;
    local_168.h = (this->super_MultiHeadAttention).out_weight_data.h;
    local_168.d = (this->super_MultiHeadAttention).out_weight_data.d;
    local_168.c = (this->super_MultiHeadAttention).out_weight_data.c;
    local_168.cstep = (this->super_MultiHeadAttention).out_weight_data.cstep;
  }
  pMVar2 = &(this->super_MultiHeadAttention).out_bias_data;
  if ((Mat *)&local_120 != pMVar2) {
    piVar3 = (this->super_MultiHeadAttention).out_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    if (piStack_118 != (int *)0x0) {
      LOCK();
      *piStack_118 = *piStack_118 + -1;
      UNLOCK();
      if (*piStack_118 == 0) {
        if (local_100 == (Allocator *)0x0) {
          if (local_120 != (void *)0x0) {
            free(local_120);
          }
        }
        else {
          (*local_100->_vptr_Allocator[3])();
        }
      }
    }
    local_120 = (this->super_MultiHeadAttention).out_bias_data.data;
    piStack_118 = (this->super_MultiHeadAttention).out_bias_data.refcount;
    local_110 = (this->super_MultiHeadAttention).out_bias_data.elemsize;
    local_108 = (this->super_MultiHeadAttention).out_bias_data.elempack;
    local_100 = (this->super_MultiHeadAttention).out_bias_data.allocator;
    local_f8._0_4_ = (this->super_MultiHeadAttention).out_bias_data.dims;
    local_f8._4_4_ = (this->super_MultiHeadAttention).out_bias_data.w;
    uStack_f0._0_4_ = (this->super_MultiHeadAttention).out_bias_data.h;
    uStack_f0._4_4_ = (this->super_MultiHeadAttention).out_bias_data.d;
    local_e8 = (this->super_MultiHeadAttention).out_bias_data.c;
    local_e0 = (this->super_MultiHeadAttention).out_bias_data.cstep;
  }
  local_1b8._64_8_ = 0;
  local_1b8._0_8_ = (_func_int **)0x0;
  local_1b8._8_4_ = 0;
  local_1b8._12_4_ = 0;
  local_1b8._16_4_ = 0;
  local_1b8._20_4_ = 0;
  local_1b8._24_4_ = 0;
  local_1b8._32_8_ = (Allocator *)0x0;
  local_1b8._40_4_ = 0;
  local_1b8._44_4_ = 0;
  local_1b8._48_4_ = 0;
  local_1b8._52_4_ = 0;
  local_1b8._56_4_ = 0;
  Mat::create((Mat *)local_1b8,1,4,(Allocator *)0x0);
  *(float *)local_1b8._0_8_ = (this->super_MultiHeadAttention).out_weight_data_int8_scale;
  piVar3 = (int *)CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (piStack_d0 != (int *)0x0) {
    LOCK();
    *piStack_d0 = *piStack_d0 + -1;
    UNLOCK();
    if (*piStack_d0 == 0) {
      if (local_b8 == (Allocator *)0x0) {
        if (local_d8 != (_func_int **)0x0) {
          free(local_d8);
        }
      }
      else {
        (*local_b8->_vptr_Allocator[3])();
      }
    }
  }
  piStack_d0 = (int *)CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
  local_d8 = (_func_int **)local_1b8._0_8_;
  local_c8 = CONCAT44(local_1b8._20_4_,local_1b8._16_4_);
  local_c0 = local_1b8._24_4_;
  local_b8 = (Allocator *)local_1b8._32_8_;
  local_b0 = CONCAT44(local_1b8._44_4_,local_1b8._40_4_);
  uStack_a8 = CONCAT44(local_1b8._52_4_,local_1b8._48_4_);
  local_a0 = local_1b8._56_4_;
  local_98 = local_1b8._64_8_;
  pLVar7 = this->o_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_168);
  (*pLVar7->_vptr_Layer[3])(pLVar7,&local_40);
  ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
  (*this->o_gemm->_vptr_Layer[4])(this->o_gemm,&local_88);
  if ((char)local_88 == '\x01') {
    piVar3 = (this->super_MultiHeadAttention).out_weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->super_MultiHeadAttention).out_weight_data.data;
        pAVar5 = (this->super_MultiHeadAttention).out_weight_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).out_weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).out_weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).out_weight_data.elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->super_MultiHeadAttention).out_weight_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).out_weight_data.dims = 0;
    (this->super_MultiHeadAttention).out_weight_data.w = 0;
    (this->super_MultiHeadAttention).out_weight_data.h = 0;
    (this->super_MultiHeadAttention).out_weight_data.d = 0;
    (this->super_MultiHeadAttention).out_weight_data.c = 0;
    piVar3 = (this->super_MultiHeadAttention).out_bias_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = (this->super_MultiHeadAttention).out_bias_data.data;
        pAVar5 = (this->super_MultiHeadAttention).out_bias_data.allocator;
        if (pAVar5 == (Allocator *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (*pAVar5->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_MultiHeadAttention).out_bias_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).out_bias_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_MultiHeadAttention).out_bias_data.elemsize + 4) = 0;
    pMVar2->data = (void *)0x0;
    (this->super_MultiHeadAttention).out_bias_data.refcount = (int *)0x0;
    (this->super_MultiHeadAttention).out_bias_data.dims = 0;
    (this->super_MultiHeadAttention).out_bias_data.w = 0;
    (this->super_MultiHeadAttention).out_bias_data.h = 0;
    (this->super_MultiHeadAttention).out_bias_data.d = 0;
    (this->super_MultiHeadAttention).out_bias_data.c = 0;
  }
  piVar3 = (int *)CONCAT44(local_1b8._12_4_,local_1b8._8_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if ((Allocator *)local_1b8._32_8_ == (Allocator *)0x0) {
        if ((_func_int **)local_1b8._0_8_ != (_func_int **)0x0) {
          free((void *)local_1b8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1b8._32_8_)[3])();
      }
    }
  }
  lVar8 = 0x90;
  do {
    piVar3 = *(int **)((long)&local_168.refcount + lVar8);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar4 = *(void **)((long)&local_168.data + lVar8);
        plVar6 = *(long **)((long)&local_168.allocator + lVar8);
        if (plVar6 == (long *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (**(code **)(*plVar6 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&local_168.cstep + lVar8) = 0;
    *(undefined8 *)((long)&local_168.refcount + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_168.elemsize + lVar8 + 4) = 0;
    *(undefined8 *)((long)&local_168.data + lVar8) = 0;
    *(undefined8 *)((long)&local_168.refcount + lVar8) = 0;
    *(undefined8 *)((long)&local_168.dims + lVar8) = 0;
    *(undefined8 *)((long)&local_168.h + lVar8) = 0;
    *(undefined4 *)((long)&local_168.c + lVar8) = 0;
    lVar8 = lVar8 + -0x48;
  } while (lVar8 != -0x48);
  ParamDict::~ParamDict(&PStack_1c8);
  pLVar7 = create_layer_cpu(0x4a);
  this->qk_gemm = pLVar7;
  ParamDict::ParamDict((ParamDict *)local_1b8);
  ParamDict::set((ParamDict *)local_1b8,2,1);
  ParamDict::set((ParamDict *)local_1b8,3,0);
  ParamDict::set((ParamDict *)local_1b8,4,0);
  ParamDict::set((ParamDict *)local_1b8,5,0);
  ParamDict::set((ParamDict *)local_1b8,6,(uint)((this->super_MultiHeadAttention).attn_mask == 0));
  ParamDict::set((ParamDict *)local_1b8,7,0);
  ParamDict::set((ParamDict *)local_1b8,8,0);
  ParamDict::set((ParamDict *)local_1b8,9,0);
  ParamDict::set((ParamDict *)local_1b8,10,
                 -(uint)((this->super_MultiHeadAttention).attn_mask == 0) | 3);
  ParamDict::set((ParamDict *)local_1b8,0xb,0);
  ParamDict::set((ParamDict *)local_1b8,0xc,1);
  ParamDict::set((ParamDict *)local_1b8,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->qk_gemm->_vptr_Layer[2])();
  pLVar7 = this->qk_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_168,(Mat *)0x0);
  (*pLVar7->_vptr_Layer[3])(pLVar7,&local_168);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_168);
  local_168.refcount = (int *)pAStack_80;
  local_168.elemsize = (size_t)pAStack_78;
  local_168.elempack = (int)uStack_70;
  local_168._28_4_ = uStack_70._4_4_;
  local_168.allocator = local_68;
  local_168.dims = iStack_60;
  local_168.w = iStack_5c;
  local_168.h = iStack_58;
  local_168.d = iStack_54;
  local_168.c = iStack_50;
  local_168._60_4_ = uStack_4c;
  local_168.data._0_4_ = (undefined4)local_88;
  local_168.data = (void *)CONCAT44(1,local_168.data._0_4_);
  (*this->qk_gemm->_vptr_Layer[4])(this->qk_gemm,&local_168);
  ParamDict::~ParamDict((ParamDict *)local_1b8);
  pLVar7 = create_layer_cpu(0x4a);
  this->qkv_gemm = pLVar7;
  ParamDict::ParamDict((ParamDict *)local_1b8);
  ParamDict::set((ParamDict *)local_1b8,2,0);
  ParamDict::set((ParamDict *)local_1b8,3,1);
  ParamDict::set((ParamDict *)local_1b8,4,0);
  ParamDict::set((ParamDict *)local_1b8,5,0);
  ParamDict::set((ParamDict *)local_1b8,6,1);
  ParamDict::set((ParamDict *)local_1b8,7,0);
  ParamDict::set((ParamDict *)local_1b8,8,0);
  ParamDict::set((ParamDict *)local_1b8,9,0);
  ParamDict::set((ParamDict *)local_1b8,10,-1);
  ParamDict::set((ParamDict *)local_1b8,0xb,0);
  ParamDict::set((ParamDict *)local_1b8,0xc,1);
  ParamDict::set((ParamDict *)local_1b8,0xe,1);
  ParamDict::set((ParamDict *)local_1b8,0x12,(this->super_MultiHeadAttention).int8_scale_term);
  (*this->qkv_gemm->_vptr_Layer[2])();
  pLVar7 = this->qkv_gemm;
  ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&local_168,(Mat *)0x0);
  (*pLVar7->_vptr_Layer[3])(pLVar7,&local_168);
  ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_168);
  local_168.refcount = (int *)pAStack_80;
  local_168.elemsize = (size_t)pAStack_78;
  local_168.elempack = (int)uStack_70;
  local_168._28_4_ = uStack_70._4_4_;
  local_168.allocator = local_68;
  local_168.dims = iStack_60;
  local_168.w = iStack_5c;
  local_168.h = iStack_58;
  local_168.d = iStack_54;
  local_168.c = iStack_50;
  local_168._60_4_ = uStack_4c;
  local_168.data._0_4_ = (undefined4)local_88;
  local_168.data = (void *)CONCAT44(1,local_168.data._0_4_);
  (*this->qkv_gemm->_vptr_Layer[4])(this->qkv_gemm,&local_168);
  ParamDict::~ParamDict((ParamDict *)local_1b8);
  return 0;
}

Assistant:

int MultiHeadAttention_x86_avx::create_pipeline(const Option& _opt)
{
    Option opt = _opt;
    if (int8_scale_term)
    {
        support_packing = false;

        opt.use_packing_layout = false; // TODO enable packing
    }

    {
        qk_softmax = ncnn::create_layer_cpu(ncnn::LayerType::Softmax);
        ncnn::ParamDict pd;
        pd.set(0, -1);
        pd.set(1, 1);
        qk_softmax->load_param(pd);
        qk_softmax->load_model(ModelBinFromMatArray(0));
        qk_softmax->create_pipeline(opt);
    }

    const int qdim = weight_data_size / embed_dim;

    {
        q_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(0, scale);
        pd.set(1, 1.f);
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, qdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        q_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = q_weight_data;
        weights[1] = q_bias_data;
#if NCNN_INT8
        weights[2] = q_weight_data_int8_scales;
#endif
        q_gemm->load_model(ModelBinFromMatArray(weights));
        q_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            q_weight_data.release();
            q_bias_data.release();
        }
    }

    {
        k_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, kdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        k_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = k_weight_data;
        weights[1] = k_bias_data;
#if NCNN_INT8
        weights[2] = k_weight_data_int8_scales;
#endif
        k_gemm->load_model(ModelBinFromMatArray(weights));
        k_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            k_weight_data.release();
            k_bias_data.release();
        }
    }

    {
        v_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 1);         // constantA
        pd.set(5, 0);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, embed_dim); // M
        pd.set(8, 0);         // N
        pd.set(9, vdim);      // K
        pd.set(10, 1);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
        pd.set(12, 1);        // output_elempack
        pd.set(14, 0);        // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        v_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = v_weight_data;
        weights[1] = v_bias_data;
#if NCNN_INT8
        weights[2] = v_weight_data_int8_scales;
#endif
        v_gemm->load_model(ModelBinFromMatArray(weights));
        v_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            v_weight_data.release();
            v_bias_data.release();
        }
    }

    {
        o_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);         // transA
        pd.set(3, 1);         // transB
        pd.set(4, 0);         // constantA
        pd.set(5, 1);         // constantB
        pd.set(6, 1);         // constantC
        pd.set(7, 0);         // M = outch
        pd.set(8, qdim);      // N = size
        pd.set(9, embed_dim); // K = maxk*inch
        pd.set(10, 4);        // constant_broadcast_type_C
        pd.set(11, 0);        // output_N1M
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        o_gemm->load_param(pd);
        Mat weights[3];
        weights[0] = out_weight_data;
        weights[1] = out_bias_data;
#if NCNN_INT8
        Mat out_weight_data_int8_scales(1);
        out_weight_data_int8_scales[0] = out_weight_data_int8_scale;
        weights[2] = out_weight_data_int8_scales;
#endif
        o_gemm->load_model(ModelBinFromMatArray(weights));
        o_gemm->create_pipeline(opt);

        if (opt.lightmode)
        {
            out_weight_data.release();
            out_bias_data.release();
        }
    }

    {
        qk_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 1);                   // transA
        pd.set(3, 0);                   // transB
        pd.set(4, 0);                   // constantA
        pd.set(5, 0);                   // constantB
        pd.set(6, attn_mask ? 0 : 1);   // constantC
        pd.set(7, 0);                   // M
        pd.set(8, 0);                   // N
        pd.set(9, 0);                   // K
        pd.set(10, attn_mask ? 3 : -1); // constant_broadcast_type_C
        pd.set(11, 0);                  // output_N1M
        pd.set(12, 1);                  // output_elempack
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        qk_gemm->load_param(pd);
        qk_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qk_gemm->create_pipeline(opt1);
    }

    {
        qkv_gemm = ncnn::create_layer_cpu(ncnn::LayerType::Gemm);
        ncnn::ParamDict pd;
        pd.set(2, 0);   // transA
        pd.set(3, 1);   // transB
        pd.set(4, 0);   // constantA
        pd.set(5, 0);   // constantB
        pd.set(6, 1);   // constantC
        pd.set(7, 0);   // M
        pd.set(8, 0);   // N
        pd.set(9, 0);   // K
        pd.set(10, -1); // constant_broadcast_type_C
        pd.set(11, 0);  // output_N1M
        pd.set(12, 1);  // output_elempack
        pd.set(14, 1);  // output_transpose
#if NCNN_INT8
        pd.set(18, int8_scale_term);
#endif
        qkv_gemm->load_param(pd);
        qkv_gemm->load_model(ModelBinFromMatArray(0));
        Option opt1 = opt;
        opt1.num_threads = 1;
        qkv_gemm->create_pipeline(opt1);
    }

    return 0;
}